

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<int,duckdb::string_t,duckdb::ArgMinMaxState<int,duckdb::string_t>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,ArgMinMaxState<int,_duckdb::string_t> *state,
          int x_data,string_t y_data,AggregateBinaryInput *binary)

{
  bool bVar1;
  undefined4 in_register_00000014;
  long lVar2;
  int local_24;
  anon_union_16_2_67f50693_for_value local_20;
  
  local_20._0_8_ = CONCAT44(in_register_00000014,x_data);
  lVar2 = y_data.value._8_8_;
  local_20.pointer.ptr = (char *)y_data.value._0_8_;
  local_24 = (int)state;
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (*(TemplatedValidityMask<unsigned_long> **)(lVar2 + 0x10),
                     *(idx_t *)(lVar2 + 0x20));
  if (bVar1) {
    bVar1 = string_t::StringComparisonOperators::GreaterThan
                      ((string_t *)(this + 8),(string_t *)&local_20.pointer);
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (*(TemplatedValidityMask<unsigned_long> **)(lVar2 + 8),
                         *(idx_t *)(lVar2 + 0x18));
      Assign<int,duckdb::string_t,duckdb::ArgMinMaxState<int,duckdb::string_t>>
                ((ArgMinMaxState<int,_duckdb::string_t> *)this,&local_24,
                 (string_t *)&local_20.pointer,!bVar1);
    }
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}